

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d34937::TplModelTest_ExponentialEntropyBoundaryTest1_Test::TestBody
          (TplModelTest_ExponentialEntropyBoundaryTest1_Test *this)

{
  char *unaff_RBX;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd8;
  AssertHelper in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  undefined8 *in_stack_fffffffffffffff0;
  
  av1_exponential_entropy(1.0,0.0);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x56f3c0,unaff_RBX,
             (double)in_stack_fffffffffffffff0,
             (double)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8),
             (double)in_stack_ffffffffffffffe0.data_);
  if (in_stack_ffffffffffffffe8 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*in_stack_fffffffffffffff0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
               ,0x2e,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffe0,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe0);
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 != (undefined8 *)0x0) {
    if ((undefined8 *)*in_stack_fffffffffffffff0 != in_stack_fffffffffffffff0 + 2) {
      operator_delete((undefined8 *)*in_stack_fffffffffffffff0);
    }
    operator_delete(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

TEST(TplModelTest, ExponentialEntropyBoundaryTest1) {
  double b = 0;
  double q_step = 1;
  double entropy = av1_exponential_entropy(q_step, b);
  EXPECT_NEAR(entropy, 0, 0.00001);
}